

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O2

int32_t icu_63::number::impl::NumberFormatterImpl::writeFractionDigits
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  int8_t digit;
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = DecimalQuantity::getLowerDisplayMagnitude(quantity);
  iVar3 = 0;
  iVar4 = -iVar1;
  if (-1 < iVar1) {
    iVar4 = iVar3;
  }
  for (iVar1 = -1; iVar1 + iVar4 != -1; iVar1 = iVar1 + -1) {
    digit = DecimalQuantity::getDigit(quantity,iVar1);
    iVar2 = utils::insertDigitFromSymbols
                      (string,iVar3 + index,digit,micros->symbols,UNUM_FRACTION_FIELD,status);
    iVar3 = iVar2 + iVar3;
  }
  return iVar3;
}

Assistant:

int32_t NumberFormatterImpl::writeFractionDigits(const MicroProps& micros, DecimalQuantity& quantity,
                                                 NumberStringBuilder& string, int32_t index,
                                                 UErrorCode& status) {
    int length = 0;
    int fractionCount = -quantity.getLowerDisplayMagnitude();
    for (int i = 0; i < fractionCount; i++) {
        // Get and append the next digit value
        int8_t nextDigit = quantity.getDigit(-i - 1);
        length += utils::insertDigitFromSymbols(
                string, length + index, nextDigit, *micros.symbols, UNUM_FRACTION_FIELD, status);
    }
    return length;
}